

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest3_4::checkActiveSubroutineUniformiv
          (FunctionalTest3_4 *this,GLuint program_id,GLuint index,GLenum pname,GLint expected)

{
  ostringstream *this_00;
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  GLchar *__s;
  size_t sVar2;
  GLint value;
  int local_1bc;
  FunctionalTest3_4 *local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  local_1b8 = this;
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_1bc = 0;
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x748))(program_id,0x8b31,index,pname,&local_1bc);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"getActiveSubroutineUniformiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0xc59);
  iVar1 = local_1bc;
  if (local_1bc != expected) {
    local_1b0._0_8_ = ((local_1b8->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"Error. Invalid result. Function: getActiveSubroutineUniformiv. ",
               0x3f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"idnex: ",7);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,". ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"pname: ",7);
    __s = Utils::pnameToStr(pname);
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,__s,sVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,". ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Result: ",8);
    std::ostream::operator<<(this_00,local_1bc);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,". ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Expected: ",10);
    std::ostream::operator<<(this_00,expected);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,".",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_138);
  }
  return iVar1 == expected;
}

Assistant:

bool FunctionalTest3_4::checkActiveSubroutineUniformiv(GLuint program_id, GLuint index, GLenum pname,
													   GLint expected) const
{
	const glw::Functions& gl	= m_context.getRenderContext().getFunctions();
	GLint				  value = 0;

	gl.getActiveSubroutineUniformiv(program_id, GL_VERTEX_SHADER, index, pname, &value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "getActiveSubroutineUniformiv");

	if (expected != value)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Error. Invalid result. Function: getActiveSubroutineUniformiv. "
											<< "idnex: " << index << ". "
											<< "pname: " << Utils::pnameToStr(pname) << ". "
											<< "Result: " << value << ". "
											<< "Expected: " << expected << "." << tcu::TestLog::EndMessage;

		return false;
	}
	else
	{
		return true;
	}
}